

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_map.c
# Opt level: O1

int nghttp2_map_insert(nghttp2_map *map,nghttp2_map_key_type key,void *data)

{
  nghttp2_map_bucket *pnVar1;
  void *data_00;
  uint tablelen;
  int iVar2;
  nghttp2_map_bucket *table;
  long lVar3;
  uint32_t uVar4;
  ulong uVar5;
  
  if (data == (void *)0x0) {
    __assert_fail("data",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_map.c"
                  ,0xde,"int nghttp2_map_insert(nghttp2_map *, nghttp2_map_key_type, void *)");
  }
  if ((ulong)(map->tablelen * 3) < map->size * 4 + 4) {
    tablelen = map->tablelen * 2;
    uVar4 = map->tablelenbits;
    table = (nghttp2_map_bucket *)nghttp2_mem_calloc(map->mem,(ulong)tablelen,0x10);
    if (table == (nghttp2_map_bucket *)0x0) {
      iVar2 = -0x385;
    }
    else {
      uVar4 = uVar4 + 1;
      if (map->tablelen != 0) {
        lVar3 = 8;
        uVar5 = 0;
        do {
          pnVar1 = map->table;
          data_00 = *(void **)((long)&pnVar1->hash + lVar3);
          if ((data_00 != (void *)0x0) &&
             (iVar2 = insert(table,tablelen,uVar4,*(uint32_t *)((long)pnVar1 + lVar3 + -8),
                             *(nghttp2_map_key_type *)((long)pnVar1 + lVar3 + -4),data_00),
             iVar2 != 0)) {
            __assert_fail("0 == rv",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_map.c"
                          ,0xd0,"int map_resize(nghttp2_map *, uint32_t, uint32_t)");
          }
          uVar5 = uVar5 + 1;
          lVar3 = lVar3 + 0x10;
        } while (uVar5 < map->tablelen);
      }
      nghttp2_mem_free(map->mem,map->table);
      map->tablelen = tablelen;
      map->tablelenbits = uVar4;
      map->table = table;
      iVar2 = 0;
    }
    if (table == (nghttp2_map_bucket *)0x0) {
      return iVar2;
    }
  }
  iVar2 = insert(map->table,map->tablelen,map->tablelenbits,key * -0x61c88647,key,data);
  if (iVar2 == 0) {
    map->size = map->size + 1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int nghttp2_map_insert(nghttp2_map *map, nghttp2_map_key_type key, void *data) {
  int rv;

  assert(data);

  /* Load factor is 0.75 */
  if ((map->size + 1) * 4 > map->tablelen * 3) {
    rv = map_resize(map, map->tablelen * 2, map->tablelenbits + 1);
    if (rv != 0) {
      return rv;
    }
  }

  rv = insert(map->table, map->tablelen, map->tablelenbits, hash(key), key,
              data);
  if (rv != 0) {
    return rv;
  }
  ++map->size;
  return 0;
}